

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::cpp::DefaultValue_abi_cxx11_(FieldDescriptor *field)

{
  CppType CVar1;
  FieldDescriptor *in_RSI;
  string *in_RDI;
  int64 in_stack_00000020;
  string *in_stack_00000028;
  FieldDescriptor *in_stack_00000370;
  Options *in_stack_00000378;
  Options *this;
  uint64 in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  FieldDescriptor *local_10;
  
  local_10 = in_RSI;
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)0x433f41);
  if (CVar1 == CPPTYPE_INT64) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"GG",&local_31);
    FieldDescriptor::default_value_int64(local_10);
    Int64ToString(in_stack_00000028,in_stack_00000020);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else if (CVar1 == CPPTYPE_UINT64) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"GG",&local_69);
    FieldDescriptor::default_value_uint64(local_10);
    UInt64ToString(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  else {
    this = (Options *)0x0;
    Options::Options((Options *)0x0);
    DefaultValue_abi_cxx11_(in_stack_00000378,in_stack_00000370);
    Options::~Options(this);
  }
  return in_RDI;
}

Assistant:

std::string DefaultValue(const FieldDescriptor* field) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT64:
      return Int64ToString("GG", field->default_value_int64());
    case FieldDescriptor::CPPTYPE_UINT64:
      return UInt64ToString("GG", field->default_value_uint64());
    default:
      return DefaultValue(Options(), field);
  }
}